

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O0

void __thiscall cfd::core::Transaction::Transaction(Transaction *this,ByteData *byte_data)

{
  string local_38;
  ByteData *local_18;
  ByteData *byte_data_local;
  Transaction *this_local;
  
  local_18 = byte_data;
  byte_data_local = (ByteData *)this;
  AbstractTransaction::AbstractTransaction(&this->super_AbstractTransaction);
  (this->super_AbstractTransaction)._vptr_AbstractTransaction =
       (_func_int **)&PTR__Transaction_00896448;
  (this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::vector(&this->vin_);
  (this->vout_).super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vout_).super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vout_).super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::vector(&this->vout_);
  ByteData::GetHex_abi_cxx11_(&local_38,local_18);
  SetFromHex(this,&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

Transaction::Transaction(const ByteData &byte_data) : vin_(), vout_() {
  SetFromHex(byte_data.GetHex());
}